

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall cmCTest::SetTest(cmCTest *this,char *ttype,bool report)

{
  bool bVar1;
  Part PVar2;
  ostream *poVar3;
  char *msg;
  string local_220 [32];
  ostringstream local_200 [8];
  ostringstream cmCTestLog_msg;
  uint local_80;
  Part p;
  Part p_1;
  allocator local_69;
  string local_68;
  string local_48;
  byte local_21;
  char *pcStack_20;
  bool report_local;
  char *ttype_local;
  cmCTest *this_local;
  
  local_21 = report;
  pcStack_20 = ttype;
  ttype_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,ttype,&local_69);
  cmsys::SystemTools::LowerCase(&local_48,&local_68);
  bVar1 = std::operator==(&local_48,"all");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  if (bVar1) {
    for (local_80 = 0; local_80 != 0xb; local_80 = local_80 + 1) {
      PartInfo::Enable(this->Parts + local_80);
    }
    this_local._7_1_ = true;
  }
  else {
    PVar2 = GetPartFromName(this,pcStack_20);
    if (PVar2 == PartCount) {
      if ((local_21 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_200);
        poVar3 = std::operator<<((ostream *)local_200,"Don\'t know about test \"");
        poVar3 = std::operator<<(poVar3,pcStack_20);
        poVar3 = std::operator<<(poVar3,"\" yet...");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        msg = (char *)std::__cxx11::string::c_str();
        Log(this,5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
            ,0x368,msg,false);
        std::__cxx11::string::~string(local_220);
        std::__cxx11::ostringstream::~ostringstream(local_200);
      }
      this_local._7_1_ = false;
    }
    else {
      PartInfo::Enable(this->Parts + PVar2);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTest::SetTest(const char* ttype, bool report)
{
  if ( cmSystemTools::LowerCase(ttype) == "all" )
    {
    for(Part p = PartStart; p != PartCount; p = Part(p+1))
      {
      this->Parts[p].Enable();
      }
    return true;
    }
  Part p = this->GetPartFromName(ttype);
  if(p != PartCount)
    {
    this->Parts[p].Enable();
    return true;
    }
  else
    {
    if ( report )
      {
      cmCTestLog(this, ERROR_MESSAGE, "Don't know about test \"" << ttype
        << "\" yet..." << std::endl);
      }
    return false;
    }
}